

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

void * Dsm_ManDeriveGia(void *pGia,int fUseMuxes)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *vCover_00;
  int *piVar7;
  word *pTruth_00;
  Gia_Man_t *pGVar8;
  bool bVar9;
  word *pTruth;
  int iVar;
  int iLut;
  int i;
  int k;
  Gia_Obj_t *pObj;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p;
  int fUseMuxes_local;
  void *pGia_local;
  
  iVar1 = Gia_ManHasMapping((Gia_Man_t *)pGia);
  if (iVar1 != 0) {
    iVar1 = Gia_ManObjNum((Gia_Man_t *)pGia);
    p_00 = Gia_ManStart((iVar1 * 6) / 5 + 100);
    pcVar3 = Abc_UtilStrsav(*pGia);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(*(char **)((long)pGia + 8));
    p_00->pSpec = pcVar3;
    iVar1 = Gia_ManObjNum((Gia_Man_t *)pGia);
    pVVar4 = Vec_IntStart((iVar1 * 6) / 5 + 100);
    p_00->vLevels = pVVar4;
    if (fUseMuxes != 0) {
      puVar5 = (uint *)calloc((long)p_00->nObjsAlloc,4);
      p_00->pMuxes = puVar5;
    }
    Gia_ManFillValue((Gia_Man_t *)pGia);
    pGVar6 = Gia_ManConst0((Gia_Man_t *)pGia);
    pGVar6->Value = 0;
    iVar = 0;
    while( true ) {
      iVar1 = Vec_IntSize(*(Vec_Int_t **)((long)pGia + 0x40));
      bVar9 = false;
      if (iVar < iVar1) {
        _i = Gia_ManCi((Gia_Man_t *)pGia,iVar);
        bVar9 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      uVar2 = Gia_ManAppendCi(p_00);
      _i->Value = uVar2;
      iVar = iVar + 1;
    }
    pVVar4 = Vec_IntAlloc(0x10);
    vCover_00 = Vec_IntAlloc(0x10000);
    Gia_ManHashStart(p_00);
    iVar1 = Gia_ManLutSizeMax((Gia_Man_t *)pGia);
    Gia_ObjComputeTruthTableStart((Gia_Man_t *)pGia,iVar1);
    pTruth._4_4_ = 0;
    while( true ) {
      bVar9 = false;
      if (pTruth._4_4_ < *(int *)((long)pGia + 0x18)) {
        _i = Gia_ManObj((Gia_Man_t *)pGia,pTruth._4_4_);
        bVar9 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ObjIsAnd(_i);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjIsBuf(_i);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsLut((Gia_Man_t *)pGia,pTruth._4_4_);
          if (iVar1 != 0) {
            Vec_IntClear(pVVar4);
            for (iLut = 0; iVar1 = Gia_ObjLutSize((Gia_Man_t *)pGia,pTruth._4_4_), iLut < iVar1;
                iLut = iLut + 1) {
              piVar7 = Gia_ObjLutFanins((Gia_Man_t *)pGia,pTruth._4_4_);
              Vec_IntPush(pVVar4,piVar7[iLut]);
            }
            pGVar6 = Gia_ManObj((Gia_Man_t *)pGia,pTruth._4_4_);
            pTruth_00 = Gia_ObjComputeTruthTableCut((Gia_Man_t *)pGia,pGVar6,pVVar4);
            Vec_IntClear(pVVar4);
            for (iLut = 0; iVar1 = Gia_ObjLutSize((Gia_Man_t *)pGia,pTruth._4_4_), iLut < iVar1;
                iLut = iLut + 1) {
              piVar7 = Gia_ObjLutFanins((Gia_Man_t *)pGia,pTruth._4_4_);
              pGVar6 = Gia_ManObj((Gia_Man_t *)pGia,piVar7[iLut]);
              Vec_IntPush(pVVar4,pGVar6->Value);
            }
            uVar2 = Dsm_ManTruthToGia(p_00,pTruth_00,pVVar4,vCover_00);
            pGVar6 = Gia_ManObj((Gia_Man_t *)pGia,pTruth._4_4_);
            pGVar6->Value = uVar2;
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_i);
          uVar2 = Gia_ManAppendBuf(p_00,iVar1);
          _i->Value = uVar2;
        }
      }
      pTruth._4_4_ = pTruth._4_4_ + 1;
    }
    Gia_ObjComputeTruthTableStop((Gia_Man_t *)pGia);
    iVar = 0;
    while( true ) {
      iVar1 = Vec_IntSize(*(Vec_Int_t **)((long)pGia + 0x48));
      bVar9 = false;
      if (iVar < iVar1) {
        _i = Gia_ManCo((Gia_Man_t *)pGia,iVar);
        bVar9 = _i != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ObjFanin0Copy(_i);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      _i->Value = uVar2;
      iVar = iVar + 1;
    }
    Gia_ManHashStop(p_00);
    iVar1 = Gia_ManRegNum((Gia_Man_t *)pGia);
    Gia_ManSetRegNum(p_00,iVar1);
    Vec_IntFree(pVVar4);
    Vec_IntFree(vCover_00);
    pGVar8 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar8;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                ,0x1ff,"void *Dsm_ManDeriveGia(void *, int)");
}

Assistant:

void * Dsm_ManDeriveGia( void * pGia, int fUseMuxes )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vCover, * vLeaves;
    Gia_Obj_t * pObj; 
    int k, i, iLut, iVar;
    word * pTruth;
    assert( Gia_ManHasMapping(p) );   
    // create new manager
    pNew = Gia_ManStart( 6*Gia_ManObjNum(p)/5 + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p)/5 + 100 );
    if ( fUseMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    // map primary inputs
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // iterate through nodes used in the mapping
    vLeaves = Vec_IntAlloc( 16 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    Gia_ManHashStart( pNew );
    Gia_ObjComputeTruthTableStart( p, Gia_ManLutSizeMax(p) );
    Gia_ManForEachAnd( p, pObj, iLut )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            continue;
        }
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        // collect leaves
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, iVar );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, iLut), vLeaves );
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, iLut, iVar, k )
            Vec_IntPush( vLeaves, Gia_ManObj(p, iVar)->Value );
        Gia_ManObj(p, iLut)->Value = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
    }
    Gia_ObjComputeTruthTableStop( p );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
/*
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        int iLev  = Gia_ObjLevelId(pNew, i);
        int iLev0 = Gia_ObjLevelId(pNew, Gia_ObjFaninId0(pObj, i));
        int iLev1 = Gia_ObjLevelId(pNew, Gia_ObjFaninId1(pObj, i));
        assert( iLev == 1 + Abc_MaxInt(iLev0, iLev1) );
    }
*/
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}